

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# album.cpp
# Opt level: O0

void __thiscall album::add_song(album *this,song *_song)

{
  int iVar1;
  int *piVar2;
  int length;
  undefined1 local_20 [16];
  song *_song_local;
  album *this_local;
  
  local_20._8_8_ = _song;
  _song_local = (song *)this;
  std::make_unique<song,song_const&>((song *)local_20);
  std::
  vector<std::unique_ptr<song,_std::default_delete<song>_>,_std::allocator<std::unique_ptr<song,_std::default_delete<song>_>_>_>
  ::push_back(&this->songs,(value_type *)local_20);
  std::unique_ptr<song,_std::default_delete<song>_>::~unique_ptr
            ((unique_ptr<song,_std::default_delete<song>_> *)local_20);
  iVar1 = song::get_seconds((song *)local_20._8_8_);
  this->length = iVar1 + this->length;
  if (0x1c20 < this->length) {
    piVar2 = (int *)__cxa_allocate_exception(4);
    *piVar2 = this->length;
    __cxa_throw(piVar2,&int::typeinfo,0);
  }
  return;
}

Assistant:

void album::add_song( const song &_song ){

    try{
        songs.push_back( std::make_unique < song > ( _song ) );
        length += _song.get_seconds();
        if( length > 7200 ) throw( length );
    }
    catch ( int length ){
        std::cout << name << " lasts longer than 2h [nobody will listen to it]\n";
    }

}